

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

Seq __thiscall xt::VSeq::next(VSeq *this)

{
  VSeq *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  Seq SVar1;
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  if (*(int *)(in_RSI + 0x18) + 1U < **(uint **)(in_RSI + 8)) {
    this_00 = (VSeq *)operator_new(0x20);
    std::__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,(__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
    VSeq(this_00,(Vector *)&_Stack_38,*(int *)(in_RSI + 0x18) + 1);
    std::__shared_ptr<xt::ISeq,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<xt::VSeq,void>
              ((__shared_ptr<xt::ISeq,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    (this->super_ISeq)._vptr_ISeq = (_func_int **)0x0;
    (this->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  SVar1.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  SVar1.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_ISeq;
  return (Seq)SVar1.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Seq VSeq::next() const { if (index+1 < v->cnt) return Seq(new VSeq(v, index+1));  return Seq(); }